

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

bool __thiscall
VertexClustering::localEnergyRelease
          (VertexClustering *this,VCCluster *c1,VCCluster *c2,VCEdge *e,
          queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q2,bool constrain)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double *pdVar4;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *in_RCX;
  VCEdge *in_RDX;
  VCFace *in_RSI;
  VertexClustering *in_RDI;
  byte in_R9B;
  VCCluster *c1_00;
  VertexClustering *this_00;
  bool c2_ok;
  bool c1_ok;
  double minEnergy;
  double L2;
  double L1;
  double L0;
  VCFace *in_stack_ffffffffffffff78;
  VCFace *in_stack_ffffffffffffff80;
  double local_50;
  double local_48;
  double local_40;
  byte local_31;
  
  local_31 = in_R9B & 1;
  if (((ulong)(in_RSI->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] & 1) == 0) {
    if (((ulong)in_RDX[6].f1 & 1) == 0) {
      in_stack_ffffffffffffff80 = (VCFace *)(**(code **)(*(long *)in_RSI + 0x20))();
      local_40 = (double)(*(code *)(in_RDX->f1->normal).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2])();
      local_40 = (double)in_stack_ffffffffffffff80 + local_40;
      c1_00 = (VCCluster *)
              (**(code **)(*(long *)in_RSI + 0x28))
                        (in_RSI,(in_RCX->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>.
                                _M_impl.super__Deque_impl_data._M_map_size);
      local_48 = (double)(*(code *)(in_RDX->f1->K).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[1])
                                   (in_RDX,(in_RCX->c).
                                           super__Deque_base<VCEdge,_std::allocator<VCEdge>_>.
                                           _M_impl.super__Deque_impl_data._M_map_size);
      local_48 = (double)c1_00 + local_48;
      this_00 = (VertexClustering *)
                (**(code **)(*(long *)in_RSI + 0x30))
                          (in_RSI,(in_RCX->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>.
                                  _M_impl.super__Deque_impl_data._M_map);
      local_50 = (double)(*(code *)(in_RDX->f1->K).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[0])
                                   (in_RDX,(in_RCX->c).
                                           super__Deque_base<VCEdge,_std::allocator<VCEdge>_>.
                                           _M_impl.super__Deque_impl_data._M_map);
      local_50 = (double)this_00 + local_50;
      if ((local_31 & 1) != 0) {
        bVar2 = transferLeadsToDisconnect(this_00,c1_00,in_stack_ffffffffffffff80);
        bVar3 = transferLeadsToDisconnect(this_00,c1_00,in_stack_ffffffffffffff80);
        if (!bVar3) {
          local_48 = std::numeric_limits<double>::max();
        }
        if (!bVar2) {
          local_50 = std::numeric_limits<double>::max();
        }
      }
      pdVar4 = std::min<double>(&local_40,&local_48);
      pdVar4 = std::min<double>(pdVar4,&local_50);
      dVar1 = *pdVar4;
      if ((dVar1 != local_48) || (NAN(dVar1) || NAN(local_48))) {
        if ((dVar1 != local_50) || (NAN(dVar1) || NAN(local_50))) {
          std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push
                    ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)
                     in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
          return false;
        }
        goto LAB_00281bde;
      }
    }
    VCCluster::giveItem((VCCluster *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        (VCCluster *)0x281bb7);
    pushNeighbors(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  else {
LAB_00281bde:
    VCCluster::giveItem((VCCluster *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        (VCCluster *)0x281bf5);
    pushNeighbors(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return true;
}

Assistant:

bool VertexClustering::localEnergyRelease(VCCluster* c1, VCCluster* c2, VCEdge& e, queue<VCEdge> *q2, bool constrain) {
	double L0, L1, L2;
	if (c1->isNull) goto localEnergyRelease_c1_c2;
	if (c2->isNull) goto localEnergyRelease_c2_c1;
	L0 = c1->energy() + c2->energy();
	L1 = c1->energyWithItem(e.f2) + c2->energyWithoutItem(e.f2);
	L2 = c1->energyWithoutItem(e.f1) + c2->energyWithItem(e.f1);
	double minEnergy;
	if (constrain) {
		bool c1_ok = transferLeadsToDisconnect(c1, e.f1);
		bool c2_ok = transferLeadsToDisconnect(c2, e.f2);
		if (!c2_ok) 
			L1 = numeric_limits<double>::max();
		if (!c1_ok) 
			L2 = numeric_limits<double>::max();
	}
	minEnergy = min(min(L0, L1), L2);
	if (minEnergy == L1) 
		goto localEnergyRelease_c2_c1;
	else if (minEnergy == L2) 
		goto localEnergyRelease_c1_c2;
	q2->push(e);
	return false;

localEnergyRelease_c2_c1:
	c2->giveItem(e.f2, c1);
	pushNeighbors(e.f2, e, q2);
	return true;
localEnergyRelease_c1_c2:
	c1->giveItem(e.f1, c2);
	pushNeighbors(e.f1, e, q2);
	return true;
}